

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
ocl::OpenCLKernelArg::OpenCLKernelArg<char>
          (OpenCLKernelArg *this,shared_device_buffer_typed<char> *arg)

{
  cl_mem p_Var1;
  size_t sVar2;
  ocl_exception local_28;
  shared_device_buffer *local_18;
  shared_device_buffer_typed<char> *arg_local;
  OpenCLKernelArg *this_local;
  
  this->is_null = false;
  this->size = 8;
  local_18 = (shared_device_buffer *)arg;
  arg_local = (shared_device_buffer_typed<char> *)this;
  p_Var1 = gpu::shared_device_buffer::clmem((shared_device_buffer *)arg);
  this->cl_mem_storage = p_Var1;
  this->value = &this->cl_mem_storage;
  sVar2 = gpu::shared_device_buffer::cloffset(local_18);
  if (sVar2 != 0) {
    ocl_exception::ocl_exception(&local_28,"Offset is not zero, but ignored!");
    ocl_exception::~ocl_exception(&local_28);
  }
  return;
}

Assistant:

OpenCLKernelArg::OpenCLKernelArg(const gpu::shared_device_buffer_typed<T> &arg)
{
	is_null = false;
	size = sizeof(cl_mem);
	cl_mem_storage = arg.clmem();
	value = &cl_mem_storage;
	if (arg.cloffset() != 0) {
		ocl_exception("Offset is not zero, but ignored!");
	}
}